

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O3

void fct_nlist__final(fct_nlist_t *list,fct_nlist_on_del_t on_del)

{
  size_t sVar1;
  
  if (list != (fct_nlist_t *)0x0) {
    if ((on_del != (fct_nlist_on_del_t)0x0) && (list->used_itm_num != 0)) {
      sVar1 = 0;
      do {
        (*on_del)(list->itm_list[sVar1]);
        sVar1 = sVar1 + 1;
      } while (sVar1 != list->used_itm_num);
    }
    list->used_itm_num = 0;
    free(list->itm_list);
    return;
  }
  __assert_fail("list != ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x2ee,
                "void fct_nlist__final(fct_nlist_t *, fct_nlist_on_del_t)");
}

Assistant:

static void
fct_nlist__final(fct_nlist_t *list, fct_nlist_on_del_t on_del)
{
    FCT_ASSERT( list != NULL );
    fct_nlist__clear(list, on_del);
    free(list->itm_list);
}